

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  code *UNRECOVERED_JUMPTABLE;
  FieldType FVar2;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  double *pdVar6;
  const_reference pdVar7;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar9;
  const_reference plVar10;
  long *plVar11;
  int *piVar12;
  const_reference puVar13;
  uint64_t *puVar14;
  const_reference pbVar15;
  float *pfVar16;
  const_reference pfVar17;
  unsigned_long *puVar18;
  const_reference puVar19;
  const_reference piVar20;
  uint *puVar21;
  MessageLite *pMVar22;
  int i;
  int iVar23;
  size_t sVar24;
  undefined8 *puVar25;
  string_view s;
  string_view s_00;
  string_view s_01;
  LogMessage local_40;
  
  if (this->is_repeated == true) {
    if (this->is_packed == true) {
      if (*(int *)(this->cached_size).int_ == 0) {
        return target;
      }
      puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar5 = WireFormatLite::WriteTagToArray(number,WIRETYPE_LENGTH_DELIMITED,puVar5);
      pdVar6 = (double *)
               io::CodedOutputStream::WriteVarint32SignExtendedToArray
                         (*(int32_t *)(this->cached_size).int_,puVar5);
      FVar2 = anon_unknown_59::real_type(this->type);
      switch(FVar2) {
      case TYPE_DOUBLE:
        break;
      case TYPE_FLOAT:
        for (iVar23 = 0; iVar4 = RepeatedField<float>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          pfVar16 = (float *)io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          pfVar17 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,iVar23);
          *pfVar16 = *pfVar17;
          pdVar6 = (double *)(pfVar16 + 1);
        }
        return (uint8_t *)pdVar6;
      case TYPE_INT64:
        for (iVar23 = 0; iVar4 = RepeatedField<long>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          puVar14 = (uint64_t *)
                    RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar23);
          pdVar6 = (double *)io::CodedOutputStream::WriteVarint64ToArray(*puVar14,puVar5);
        }
        return (uint8_t *)pdVar6;
      case TYPE_UINT64:
        for (iVar23 = 0; iVar4 = RepeatedField<unsigned_long>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          puVar19 = RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar23);
          pdVar6 = (double *)io::CodedOutputStream::WriteVarint64ToArray(*puVar19,puVar5);
        }
        return (uint8_t *)pdVar6;
      case TYPE_INT32:
        for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
          pdVar6 = (double *)
                   io::CodedOutputStream::WriteVarint32SignExtendedToArray(*piVar20,puVar5);
        }
        return (uint8_t *)pdVar6;
      case TYPE_FIXED64:
        for (iVar23 = 0; iVar4 = RepeatedField<unsigned_long>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar18 = (unsigned_long *)io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          puVar19 = RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar23);
          *puVar18 = *puVar19;
          pdVar6 = (double *)(puVar18 + 1);
        }
        return (uint8_t *)pdVar6;
      case TYPE_FIXED32:
        for (iVar23 = 0; iVar4 = RepeatedField<unsigned_int>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar21 = (uint *)io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          puVar13 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar23);
          *puVar21 = *puVar13;
          pdVar6 = (double *)(puVar21 + 1);
        }
        return (uint8_t *)pdVar6;
      case TYPE_BOOL:
        for (iVar23 = 0; iVar4 = RepeatedField<bool>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          pbVar15 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,iVar23);
          pdVar6 = (double *)WireFormatLite::WriteBoolNoTagToArray(*pbVar15,puVar5);
        }
        return (uint8_t *)pdVar6;
      case TYPE_STRING:
      case TYPE_GROUP:
      case TYPE_MESSAGE:
      case TYPE_BYTES:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x771);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_40,(char (*) [37])"Non-primitive types can\'t be packed.");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      case TYPE_UINT32:
        for (iVar23 = 0; iVar4 = RepeatedField<unsigned_int>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          puVar13 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar23);
          pdVar6 = (double *)io::CodedOutputStream::WriteVarint32ToArray(*puVar13,puVar5);
        }
        return (uint8_t *)pdVar6;
      case TYPE_ENUM:
        for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
          pdVar6 = (double *)
                   io::CodedOutputStream::WriteVarint32SignExtendedToArray(*piVar20,puVar5);
        }
        return (uint8_t *)pdVar6;
      case TYPE_SFIXED32:
        for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          piVar12 = (int *)io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
          *piVar12 = *piVar20;
          pdVar6 = (double *)(piVar12 + 1);
        }
        return (uint8_t *)pdVar6;
      case TYPE_SFIXED64:
        for (iVar23 = 0; iVar4 = RepeatedField<long>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          plVar11 = (long *)io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          plVar10 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar23);
          *plVar11 = *plVar10;
          pdVar6 = (double *)(plVar11 + 1);
        }
        return (uint8_t *)pdVar6;
      case TYPE_SINT32:
        for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
          pdVar6 = (double *)WireFormatLite::WriteSInt32NoTagToArray(*piVar20,puVar5);
        }
        return (uint8_t *)pdVar6;
      case MAX_FIELD_TYPE:
        for (iVar23 = 0; iVar4 = RepeatedField<long>::size(this->field_0), iVar23 < iVar4;
            iVar23 = iVar23 + 1) {
          puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
          plVar10 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar23);
          pdVar6 = (double *)WireFormatLite::WriteSInt64NoTagToArray(*plVar10,puVar5);
        }
        return (uint8_t *)pdVar6;
      default:
        return (uint8_t *)pdVar6;
      }
      for (iVar23 = 0; iVar4 = RepeatedField<double>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        pdVar6 = (double *)io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)pdVar6);
        pdVar7 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,iVar23);
        *pdVar6 = *pdVar7;
        pdVar6 = pdVar6 + 1;
      }
      return (uint8_t *)pdVar6;
    }
    FVar2 = anon_unknown_59::real_type(this->type);
    switch(FVar2) {
    case TYPE_DOUBLE:
      for (iVar23 = 0; iVar4 = RepeatedField<double>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        pdVar7 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,iVar23);
        target = WireFormatLite::WriteDoubleToArray(number,*pdVar7,puVar5);
      }
      return target;
    case TYPE_FLOAT:
      for (iVar23 = 0; iVar4 = RepeatedField<float>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        pfVar17 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,iVar23);
        target = WireFormatLite::WriteFloatToArray(number,*pfVar17,puVar5);
      }
      return target;
    case TYPE_INT64:
      for (iVar23 = 0; iVar4 = RepeatedField<long>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        plVar10 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar23);
        target = WireFormatLite::WriteInt64ToArray(number,*plVar10,puVar5);
      }
      return target;
    case TYPE_UINT64:
      for (iVar23 = 0; iVar4 = RepeatedField<unsigned_long>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        puVar19 = RepeatedField<unsigned_long>::Get
                            ((RepeatedField<unsigned_long> *)this->field_0,iVar23);
        target = WireFormatLite::WriteUInt64ToArray(number,*puVar19,puVar5);
      }
      return target;
    case TYPE_INT32:
      for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
        target = WireFormatLite::WriteInt32ToArray(number,*piVar20,puVar5);
      }
      return target;
    case TYPE_FIXED64:
      for (iVar23 = 0; iVar4 = RepeatedField<unsigned_long>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        puVar19 = RepeatedField<unsigned_long>::Get
                            ((RepeatedField<unsigned_long> *)this->field_0,iVar23);
        target = WireFormatLite::WriteFixed64ToArray(number,*puVar19,puVar5);
      }
      return target;
    case TYPE_FIXED32:
      for (iVar23 = 0; iVar4 = RepeatedField<unsigned_int>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        puVar13 = RepeatedField<unsigned_int>::Get
                            ((RepeatedField<unsigned_int> *)this->field_0,iVar23);
        target = WireFormatLite::WriteFixed32ToArray(number,*puVar13,puVar5);
      }
      return target;
    case TYPE_BOOL:
      for (iVar23 = 0; iVar4 = RepeatedField<bool>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        pbVar15 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,iVar23);
        target = WireFormatLite::WriteBoolToArray(number,*pbVar15,puVar5);
      }
      return target;
    case TYPE_STRING:
      iVar23 = 0;
      break;
    case TYPE_GROUP:
      for (iVar23 = 0; iVar23 < *(int *)((this->field_0).int64_t_value + 8); iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        pVVar9 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                           ((RepeatedPtrFieldBase *)this->field_0,iVar23);
        target = WireFormatLite::InternalWriteGroup(number,pVVar9,puVar5,stream);
      }
      return target;
    case TYPE_MESSAGE:
      for (iVar23 = 0;
          iVar23 < ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value)->current_size_;
          iVar23 = iVar23 + 1) {
        pVVar9 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                           ((RepeatedPtrFieldBase *)(this->field_0).int64_t_value,iVar23);
        iVar4 = MessageLite::GetCachedSize(pVVar9);
        target = WireFormatLite::InternalWriteMessage(number,pVVar9,iVar4,target,stream);
      }
      return target;
    case TYPE_BYTES:
      iVar23 = 0;
      do {
        if (*(int *)((this->field_0).int64_t_value + 8) <= iVar23) {
          return target;
        }
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        pVVar8 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                           ((RepeatedPtrFieldBase *)this->field_0,iVar23);
        sVar24 = pVVar8->_M_string_length;
        if ((long)sVar24 < 0x80) {
          puVar1 = stream->end_;
          iVar4 = io::EpsCopyOutputStream::TagSize(number * 8);
          if ((long)(puVar1 + ~(ulong)(puVar5 + iVar4) + 0x10) < (long)sVar24) {
            sVar24 = pVVar8->_M_string_length;
            goto LAB_00c58aa8;
          }
          puVar5 = puVar5 + 2;
          for (uVar3 = number * 8 + 2; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
            puVar5[-2] = (byte)uVar3 | 0x80;
            puVar5 = puVar5 + 1;
          }
          puVar5[-2] = (byte)uVar3;
          puVar5[-1] = (uint8_t)sVar24;
          memcpy(puVar5,(pVVar8->_M_dataplus)._M_p,sVar24);
          target = puVar5 + sVar24;
        }
        else {
LAB_00c58aa8:
          s._M_str = (pVVar8->_M_dataplus)._M_p;
          s._M_len = sVar24;
          target = io::EpsCopyOutputStream::WriteStringOutline(stream,number,s,puVar5);
        }
        iVar23 = iVar23 + 1;
      } while( true );
    case TYPE_UINT32:
      for (iVar23 = 0; iVar4 = RepeatedField<unsigned_int>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        puVar13 = RepeatedField<unsigned_int>::Get
                            ((RepeatedField<unsigned_int> *)this->field_0,iVar23);
        target = WireFormatLite::WriteUInt32ToArray(number,*puVar13,puVar5);
      }
      return target;
    case TYPE_ENUM:
      for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
        target = WireFormatLite::WriteEnumToArray(number,*piVar20,puVar5);
      }
      return target;
    case TYPE_SFIXED32:
      for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
        target = WireFormatLite::WriteSFixed32ToArray(number,*piVar20,puVar5);
      }
      return target;
    case TYPE_SFIXED64:
      for (iVar23 = 0; iVar4 = RepeatedField<long>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        plVar10 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar23);
        target = WireFormatLite::WriteSFixed64ToArray(number,*plVar10,puVar5);
      }
      return target;
    case TYPE_SINT32:
      for (iVar23 = 0; iVar4 = RepeatedField<int>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        piVar20 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar23);
        target = WireFormatLite::WriteSInt32ToArray(number,*piVar20,puVar5);
      }
      return target;
    case MAX_FIELD_TYPE:
      for (iVar23 = 0; iVar4 = RepeatedField<long>::size(this->field_0), iVar23 < iVar4;
          iVar23 = iVar23 + 1) {
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
        plVar10 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar23);
        target = WireFormatLite::WriteSInt64ToArray(number,*plVar10,puVar5);
      }
      return target;
    default:
      return target;
    }
    do {
      if (*(int *)((this->field_0).int64_t_value + 8) <= iVar23) {
        return target;
      }
      puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      pVVar8 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this->field_0,iVar23);
      sVar24 = pVVar8->_M_string_length;
      if ((long)sVar24 < 0x80) {
        puVar1 = stream->end_;
        iVar4 = io::EpsCopyOutputStream::TagSize(number * 8);
        if ((long)(puVar1 + ~(ulong)(puVar5 + iVar4) + 0x10) < (long)sVar24) {
          sVar24 = pVVar8->_M_string_length;
          goto LAB_00c5916b;
        }
        puVar5 = puVar5 + 2;
        for (uVar3 = number * 8 + 2; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
          puVar5[-2] = (byte)uVar3 | 0x80;
          puVar5 = puVar5 + 1;
        }
        puVar5[-2] = (byte)uVar3;
        puVar5[-1] = (uint8_t)sVar24;
        memcpy(puVar5,(pVVar8->_M_dataplus)._M_p,sVar24);
        target = puVar5 + sVar24;
      }
      else {
LAB_00c5916b:
        s_00._M_str = (pVVar8->_M_dataplus)._M_p;
        s_00._M_len = sVar24;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,number,s_00,puVar5);
      }
      iVar23 = iVar23 + 1;
    } while( true );
  }
  if ((this->field_0xa & 2) != 0) {
    return target;
  }
  FVar2 = anon_unknown_59::real_type(this->type);
  switch(FVar2) {
  case TYPE_DOUBLE:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteDoubleToArray(number,(this->field_0).double_value,puVar5);
    return puVar5;
  case TYPE_FLOAT:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteFloatToArray(number,(this->field_0).float_value,puVar5);
    return puVar5;
  case TYPE_INT64:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteInt64ToArray(number,(this->field_0).int64_t_value,puVar5);
    return puVar5;
  case TYPE_UINT64:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteUInt64ToArray(number,(this->field_0).uint64_t_value,puVar5);
    return puVar5;
  case TYPE_INT32:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteInt32ToArray(number,(this->field_0).int32_t_value,puVar5);
    return puVar5;
  case TYPE_FIXED64:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteFixed64ToArray(number,(this->field_0).uint64_t_value,puVar5);
    return puVar5;
  case TYPE_FIXED32:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteFixed32ToArray(number,(this->field_0).uint32_t_value,puVar5);
    return puVar5;
  case TYPE_BOOL:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteBoolToArray(number,(this->field_0).bool_value,puVar5);
    return puVar5;
  case TYPE_STRING:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar25 = *(undefined8 **)&(this->field_0).int32_t_value;
    sVar24 = puVar25[1];
    if (0x7f < (long)sVar24) goto LAB_00c594ed;
    puVar1 = stream->end_;
    iVar23 = io::EpsCopyOutputStream::TagSize(number * 8);
    if ((long)(puVar1 + ~(ulong)(puVar5 + iVar23) + 0x10) < (long)sVar24) {
LAB_00c594e5:
      sVar24 = puVar25[1];
LAB_00c594ed:
      s_01._M_str = (char *)*puVar25;
      s_01._M_len = sVar24;
      puVar5 = io::EpsCopyOutputStream::WriteStringOutline(stream,number,s_01,puVar5);
      return puVar5;
    }
    puVar5 = puVar5 + 2;
    for (uVar3 = number * 8 | 2; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      puVar5[-2] = (byte)uVar3 | 0x80;
      puVar5 = puVar5 + 1;
    }
    break;
  case TYPE_GROUP:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::InternalWriteGroup(number,(MessageLite *)this->field_0,puVar5,stream);
    return puVar5;
  case TYPE_MESSAGE:
    if ((this->field_0xa & 4) == 0) {
      this_00 = this->field_0;
      iVar23 = MessageLite::GetCachedSize(this_00);
      puVar5 = WireFormatLite::InternalWriteMessage
                         (number,(MessageLite *)this_00,iVar23,target,stream);
      return puVar5;
    }
    pMVar22 = GetPrototypeForLazyMessage(extension_set,extendee,number);
    UNRECOVERED_JUMPTABLE = *(code **)(**(long **)&(this->field_0).int32_t_value + 0xa0);
    puVar5 = (uint8_t *)
             (*UNRECOVERED_JUMPTABLE)
                       (*(long **)&(this->field_0).int32_t_value,pMVar22,number,target,stream,
                        UNRECOVERED_JUMPTABLE);
    return puVar5;
  case TYPE_BYTES:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar25 = *(undefined8 **)&(this->field_0).int32_t_value;
    sVar24 = puVar25[1];
    if (0x7f < (long)sVar24) goto LAB_00c594ed;
    puVar1 = stream->end_;
    iVar23 = io::EpsCopyOutputStream::TagSize(number * 8);
    if ((long)(puVar1 + ~(ulong)(puVar5 + iVar23) + 0x10) < (long)sVar24) goto LAB_00c594e5;
    puVar5 = puVar5 + 2;
    for (uVar3 = number * 8 | 2; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      puVar5[-2] = (byte)uVar3 | 0x80;
      puVar5 = puVar5 + 1;
    }
    break;
  case TYPE_UINT32:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteUInt32ToArray(number,(this->field_0).uint32_t_value,puVar5);
    return puVar5;
  case TYPE_ENUM:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteEnumToArray(number,(this->field_0).enum_value,puVar5);
    return puVar5;
  case TYPE_SFIXED32:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteSFixed32ToArray(number,(this->field_0).int32_t_value,puVar5);
    return puVar5;
  case TYPE_SFIXED64:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteSFixed64ToArray(number,(this->field_0).int64_t_value,puVar5);
    return puVar5;
  case TYPE_SINT32:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteSInt32ToArray(number,(this->field_0).int32_t_value,puVar5);
    return puVar5;
  case MAX_FIELD_TYPE:
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar5 = WireFormatLite::WriteSInt64ToArray(number,(this->field_0).int64_t_value,puVar5);
    return puVar5;
  default:
    goto switchD_00c58799_default;
  }
  puVar5[-2] = (uint8_t)uVar3;
  puVar5[-1] = (uint8_t)sVar24;
  memcpy(puVar5,(void *)*puVar25,sVar24);
  target = puVar5 + sVar24;
switchD_00c58799_default:
  return target;
}

Assistant:

uint8_t* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size() == 0) return target;

      target = stream->EnsureSpace(target);
      target = WireFormatLite::WriteTagToArray(
          number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size(), target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##NoTagToArray(           \
          ptr.repeated_##LOWERCASE##_value->Get(i), target);             \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##ToArray(                \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = stream->WriteString(                                      \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
#undef HANDLE_TYPE
        case WireFormatLite::TYPE_GROUP:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            target = stream->EnsureSpace(target);
            target = WireFormatLite::InternalWriteGroup(
                number, ptr.repeated_message_value->Get(i), target, stream);
          }
          break;
        case WireFormatLite::TYPE_MESSAGE:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            auto& msg = ptr.repeated_message_value->Get(i);
            target = WireFormatLite::InternalWriteMessage(
                number, msg, msg.GetCachedSize(), target, stream);
          }
          break;
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                               \
  case WireFormatLite::TYPE_##UPPERCASE:                                       \
    target = stream->EnsureSpace(target);                                      \
    target = WireFormatLite::Write##CAMELCASE##ToArray(number, VALUE, target); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(FIXED32, Fixed32, uint32_t_value);
      HANDLE_TYPE(FIXED64, Fixed64, uint64_t_value);
      HANDLE_TYPE(SFIXED32, SFixed32, int32_t_value);
      HANDLE_TYPE(SFIXED64, SFixed64, int64_t_value);
      HANDLE_TYPE(FLOAT, Float, float_value);
      HANDLE_TYPE(DOUBLE, Double, double_value);
      HANDLE_TYPE(BOOL, Bool, bool_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)         \
  case WireFormatLite::TYPE_##UPPERCASE:                 \
    target = stream->EnsureSpace(target);                \
    target = stream->WriteString(number, VALUE, target); \
    break
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_GROUP:
        target = stream->EnsureSpace(target);
        target = WireFormatLite::InternalWriteGroup(number, *ptr.message_value,
                                                    target, stream);
        break;
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          const auto* prototype =
              extension_set->GetPrototypeForLazyMessage(extendee, number);
          target = ptr.lazymessage_value->WriteMessageToArray(prototype, number,
                                                              target, stream);
        } else {
          target = WireFormatLite::InternalWriteMessage(
              number, *ptr.message_value, ptr.message_value->GetCachedSize(),
              target, stream);
        }
        break;
    }
  }
  return target;
}